

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugins_types.c
# Opt level: O3

LY_ERR lyplg_type_validate_range
                 (LY_DATA_TYPE basetype,lysc_range *range,int64_t value,char *strval,
                 size_t strval_len,ly_err_item **err)

{
  lysc_range_part *plVar1;
  LY_ERR LVar2;
  char *apptag;
  anon_union_8_2_6b5dfd82_for_lysc_range_part_2 *paVar3;
  ulong uVar4;
  uint64_t uVar5;
  char *err_format;
  char *pcVar6;
  
  *err = (ly_err_item *)0x0;
  plVar1 = range->parts;
  paVar3 = &plVar1->field_1;
  uVar4 = 0;
  while( true ) {
    if (plVar1 == (lysc_range_part *)0x0) {
      uVar5 = 0;
    }
    else {
      uVar5 = plVar1[-1].field_1.max_u64;
    }
    if (uVar5 <= uVar4) {
      return LY_SUCCESS;
    }
    if (LY_TYPE_BOOL < basetype) {
      if ((long)(((lysc_range_part *)(paVar3 + -1))->field_0).min_u64 <= value) {
        if (value <= paVar3->max_64) {
          return LY_SUCCESS;
        }
        if (uVar4 != plVar1[-1].field_1.max_64 - 1U) goto LAB_0019b20e;
      }
      if (range->eapptag == (char *)0x0) {
        apptag = (char *)0x0;
      }
      else {
        apptag = strdup(range->eapptag);
      }
      pcVar6 = range->emsg;
      if (pcVar6 != (char *)0x0) goto LAB_0019b277;
      err_format = "Unsatisfied range - value \"%.*s\" is out of the allowed range.";
      goto LAB_0019b2b2;
    }
    if ((ulong)value < (((lysc_range_part *)(paVar3 + -1))->field_0).min_u64) break;
    if ((ulong)value <= paVar3->max_u64) {
      return LY_SUCCESS;
    }
    if (uVar4 == plVar1[-1].field_1.max_64 - 1U) break;
LAB_0019b20e:
    uVar4 = uVar4 + 1;
    paVar3 = paVar3 + 2;
  }
  if (range->eapptag == (char *)0x0) {
    apptag = (char *)0x0;
  }
  else {
    apptag = strdup(range->eapptag);
  }
  pcVar6 = range->emsg;
  if (pcVar6 == (char *)0x0) {
    err_format = "Unsatisfied range - value \"%.*s\" is out of the allowed range.";
    if (basetype == LY_TYPE_STRING || basetype == LY_TYPE_BINARY) {
      err_format = "Unsatisfied length - string \"%.*s\" length is not allowed.";
    }
  }
  else {
LAB_0019b277:
    err_format = "%s";
    strval_len = (size_t)pcVar6;
  }
LAB_0019b2b2:
  LVar2 = ly_err_new(err,LY_EVALID,LYVE_DATA,(char *)0x0,apptag,err_format,strval_len);
  return LVar2;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyplg_type_validate_range(LY_DATA_TYPE basetype, struct lysc_range *range, int64_t value, const char *strval,
        size_t strval_len, struct ly_err_item **err)
{
    LY_ARRAY_COUNT_TYPE u;
    ly_bool is_length; /* length or range */

    *err = NULL;
    is_length = (basetype == LY_TYPE_BINARY || basetype == LY_TYPE_STRING) ? 1 : 0;

    LY_ARRAY_FOR(range->parts, u) {
        if (basetype < LY_TYPE_DEC64) {
            /* unsigned */
            if ((uint64_t)value < range->parts[u].min_u64) {
                char *eapptag = range->eapptag ? strdup(range->eapptag) : NULL;

                if (range->emsg) {
                    return ly_err_new(err, LY_EVALID, LYVE_DATA, NULL, eapptag, "%s", range->emsg);
                } else {
                    return ly_err_new(err, LY_EVALID, LYVE_DATA, NULL, eapptag,
                            is_length ? LY_ERRMSG_NOLENGTH : LY_ERRMSG_NORANGE, (int)strval_len, strval);
                }
            } else if ((uint64_t)value <= range->parts[u].max_u64) {
                /* inside the range */
                return LY_SUCCESS;
            } else if (u == LY_ARRAY_COUNT(range->parts) - 1) {
                /* we have the last range part, so the value is out of bounds */
                char *eapptag = range->eapptag ? strdup(range->eapptag) : NULL;

                if (range->emsg) {
                    return ly_err_new(err, LY_EVALID, LYVE_DATA, NULL, eapptag, "%s", range->emsg);
                } else {
                    return ly_err_new(err, LY_EVALID, LYVE_DATA, NULL, eapptag,
                            is_length ? LY_ERRMSG_NOLENGTH : LY_ERRMSG_NORANGE, (int)strval_len, strval);
                }
            }
        } else {
            /* signed */
            if (value < range->parts[u].min_64) {
                char *eapptag = range->eapptag ? strdup(range->eapptag) : NULL;

                if (range->emsg) {
                    return ly_err_new(err, LY_EVALID, LYVE_DATA, NULL, eapptag, "%s", range->emsg);
                } else {
                    return ly_err_new(err, LY_EVALID, LYVE_DATA, NULL, eapptag, LY_ERRMSG_NORANGE, (int)strval_len, strval);
                }
            } else if (value <= range->parts[u].max_64) {
                /* inside the range */
                return LY_SUCCESS;
            } else if (u == LY_ARRAY_COUNT(range->parts) - 1) {
                /* we have the last range part, so the value is out of bounds */
                char *eapptag = range->eapptag ? strdup(range->eapptag) : NULL;

                if (range->emsg) {
                    return ly_err_new(err, LY_EVALID, LYVE_DATA, NULL, eapptag, "%s", range->emsg);
                } else {
                    return ly_err_new(err, LY_EVALID, LYVE_DATA, NULL, eapptag, LY_ERRMSG_NORANGE, (int)strval_len, strval);
                }
            }
        }
    }

    return LY_SUCCESS;
}